

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *rpaths)

{
  cmRuntimeDependencyArchive *this_00;
  bool bVar1;
  int iVar2;
  cmUVProcessChainBuilder *this_01;
  Status *pSVar3;
  ostream *poVar4;
  uv_loop_t *loop;
  istream *piVar5;
  RegularExpressionMatch *this_02;
  allocator<char> local_6c1;
  cmUVProcessChain process;
  undefined1 local_6b8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string line;
  cmUVProcessChainBuilder builder;
  ostringstream e;
  RegularExpressionMatch pathMatch;
  cmUVPipeIStream output;
  
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool).Archive;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,"otool",(allocator<char> *)&pathMatch);
  bVar1 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,(string *)&e,&command);
  std::__cxx11::string::~string((string *)&e);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"Could not find otool",(allocator<char> *)&pathMatch);
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    bVar1 = false;
    goto LAB_0051522c;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[3]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
             (char (*) [3])0x75d90d);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,file);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  this_01 = cmUVProcessChainBuilder::SetBuiltinStream(&builder,Stream_OUTPUT);
  cmUVProcessChainBuilder::AddCommand(this_01,&command);
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&process);
  bVar1 = cmUVProcessChain::Valid(&process);
  if (bVar1) {
    pSVar3 = cmUVProcessChain::GetStatus(&process,0);
    if (pSVar3->SpawnResult != 0) goto LAB_0051516b;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
        ::rpathRegex == '\0') {
      iVar2 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                   ::rpathRegex);
      if (iVar2 != 0) {
        cmsys::RegularExpression::RegularExpression(&GetFileInfo::rpathRegex,"^ *cmd LC_RPATH$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::rpathRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::rpathRegex);
      }
    }
    if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
        ::loadDylibRegex == '\0') {
      iVar2 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                   ::loadDylibRegex);
      if (iVar2 != 0) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::loadDylibRegex,"^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::loadDylibRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::loadDylibRegex);
      }
    }
    if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
        ::pathRegex == '\0') {
      iVar2 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                   ::pathRegex);
      if (iVar2 != 0) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::pathRegex,"^ *path (.*) \\(offset [0-9]+\\)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::pathRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::pathRegex);
      }
    }
    if (GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
        ::nameRegex == '\0') {
      iVar2 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                   ::nameRegex);
      if (iVar2 != 0) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::nameRegex,"^ *name (.*) \\(offset [0-9]+\\)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::nameRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::nameRegex);
      }
    }
    loop = cmUVProcessChain::GetLoop(&process);
    iVar2 = cmUVProcessChain::OutputStream(&process);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream(&output,loop,iVar2);
LAB_005152ed:
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&output,(string *)&line);
    if (((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) == 0) {
      memset((RegularExpressionMatch *)&e,0,0x208);
      bVar1 = cmsys::RegularExpression::find
                        (&GetFileInfo::rpathRegex,line._M_dataplus._M_p,(RegularExpressionMatch *)&e
                        );
      if (!bVar1) goto LAB_005153ba;
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&output,(string *)&line);
      if (((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) != 0) {
LAB_005154e6:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pathMatch,"Invalid output from otool",(allocator<char> *)local_6b8);
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)&pathMatch)
        ;
        goto LAB_005155ad;
      }
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&output,(string *)&line);
      if (((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) != 0)
      goto LAB_005154e6;
      memset(&pathMatch,0,0x208);
      bVar1 = cmsys::RegularExpression::find
                        (&GetFileInfo::pathRegex,line._M_dataplus._M_p,&pathMatch);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_6b8,"Invalid output from otool",&local_6c1);
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_6b8);
        goto LAB_005155ff;
      }
      cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)local_6b8,&pathMatch,1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)rpaths,
                 (string *)local_6b8);
      goto LAB_00515456;
    }
    bVar1 = cmUVProcessChain::Wait(&process,0);
    if (bVar1) {
      pSVar3 = cmUVProcessChain::GetStatus(&process,0);
      if (pSVar3->ExitStatus != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar4 = std::operator<<((ostream *)&e,"Failed to run otool on:\n  ");
        std::operator<<(poVar4,(string *)file);
        std::__cxx11::stringbuf::str();
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)&pathMatch)
        ;
        goto LAB_00515565;
      }
      bVar1 = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar4 = std::operator<<((ostream *)&e,"Failed to wait on otool process for:\n  ");
      std::operator<<(poVar4,(string *)file);
      std::__cxx11::stringbuf::str();
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)&pathMatch);
LAB_00515565:
      std::__cxx11::string::~string((string *)&pathMatch);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_00515609:
      bVar1 = false;
    }
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::~cmBasicUVPipeIStream(&output);
    std::__cxx11::string::~string((string *)&line);
  }
  else {
LAB_0051516b:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,"Failed to start otool process for:\n  ");
    std::operator<<(poVar4,(string *)file);
    std::__cxx11::stringbuf::str();
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)&pathMatch);
    std::__cxx11::string::~string((string *)&pathMatch);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar1 = false;
  }
  cmUVProcessChain::~cmUVProcessChain(&process);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
LAB_0051522c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&command);
  return bVar1;
LAB_005153ba:
  bVar1 = cmsys::RegularExpression::find
                    (&GetFileInfo::loadDylibRegex,line._M_dataplus._M_p,(RegularExpressionMatch *)&e
                    );
  if (!bVar1) goto LAB_005152ed;
  piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     ((istream *)&output,(string *)&line);
  if (((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) == 0) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&output,(string *)&line);
    if (((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) == 0) {
      memset(&pathMatch,0,0x208);
      bVar1 = cmsys::RegularExpression::find
                        (&GetFileInfo::nameRegex,line._M_dataplus._M_p,&pathMatch);
      if (bVar1) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_((string *)local_6b8,&pathMatch,1);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)libs,
                   (string *)local_6b8);
LAB_00515456:
        std::__cxx11::string::~string((string *)local_6b8);
        goto LAB_005152ed;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_6b8,"Invalid output from otool",&local_6c1);
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)local_6b8);
LAB_005155ff:
      this_02 = (RegularExpressionMatch *)local_6b8;
      goto LAB_00515604;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pathMatch,"Invalid output from otool",(allocator<char> *)local_6b8);
  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
            (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,(string *)&pathMatch);
LAB_005155ad:
  this_02 = &pathMatch;
LAB_00515604:
  std::__cxx11::string::~string((string *)this_02);
  goto LAB_00515609;
}

Assistant:

bool cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo(
  std::string const& file, std::vector<std::string>& libs,
  std::vector<std::string>& rpaths)
{
  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("otool", command)) {
    this->SetError("Could not find otool");
    return false;
  }
  command.emplace_back("-l");
  command.emplace_back(file);

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid() || process.GetStatus(0).SpawnResult != 0) {
    std::ostringstream e;
    e << "Failed to start otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression rpathRegex("^ *cmd LC_RPATH$");
  static const cmsys::RegularExpression loadDylibRegex(
    "^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
  static const cmsys::RegularExpression pathRegex(
    "^ *path (.*) \\(offset [0-9]+\\)$");
  static const cmsys::RegularExpression nameRegex(
    "^ *name (.*) \\(offset [0-9]+\\)$");
  cmUVPipeIStream output(process.GetLoop(), process.OutputStream());
  while (std::getline(output, line)) {
    cmsys::RegularExpressionMatch cmdMatch;
    if (rpathRegex.find(line.c_str(), cmdMatch)) {
      // NOLINTNEXTLINE(misc-redundant-expression)
      if (!std::getline(output, line) || !std::getline(output, line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch pathMatch;
      if (pathRegex.find(line.c_str(), pathMatch)) {
        rpaths.push_back(pathMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    } else if (loadDylibRegex.find(line.c_str(), cmdMatch)) {
      // NOLINTNEXTLINE(misc-redundant-expression)
      if (!std::getline(output, line) || !std::getline(output, line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch nameMatch;
      if (nameRegex.find(line.c_str(), nameMatch)) {
        libs.push_back(nameMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  if (process.GetStatus(0).ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run otool on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}